

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O2

Constraint *
create_set_parameter_value_constraint(char *parameter_name,intptr_t value_to_set,size_t size_to_set)

{
  Constraint *pCVar1;
  CgreenValue local_40;
  
  pCVar1 = create_constraint();
  pCVar1->type = CGREEN_CONTENT_SETTER_CONSTRAINT;
  pCVar1->compare = compare_true;
  pCVar1->execute = set_contents;
  pCVar1->name = "set parameter value";
  make_cgreen_integer_value(&local_40,value_to_set);
  (pCVar1->expected_value).value_size = local_40.value_size;
  (pCVar1->expected_value).type = local_40.type;
  *(undefined4 *)&(pCVar1->expected_value).field_0x4 = local_40._4_4_;
  (pCVar1->expected_value).value = local_40.value;
  pCVar1->size_of_expected_value = size_to_set;
  pCVar1->parameter_name = parameter_name;
  return pCVar1;
}

Assistant:

Constraint *create_set_parameter_value_constraint(const char *parameter_name, intptr_t value_to_set, size_t size_to_set) {
    Constraint* constraint = create_constraint();
    constraint->type = CGREEN_CONTENT_SETTER_CONSTRAINT;

    constraint->compare = &compare_true;
    constraint->execute = &set_contents;
    constraint->name = "set parameter value";
    constraint->expected_value = make_cgreen_integer_value(value_to_set);
    constraint->size_of_expected_value = size_to_set;
    constraint->parameter_name = parameter_name;

    return constraint;
}